

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttocsv.cpp
# Opt level: O0

void footprinttocsv::doit
               (bool skipheader,int from_event,int to_event,char *binFileName,char *idxFileName)

{
  FILE *__stream;
  bool local_61;
  size_t local_60;
  size_t i;
  undefined1 auStack_50 [4];
  EventIndex idx;
  FILE *finy;
  FILE *finx;
  bool no_event_range;
  char *idxFileName_local;
  char *binFileName_local;
  int to_event_local;
  int from_event_local;
  bool skipheader_local;
  
  if (!skipheader) {
    printf("event_id, areaperil_id, intensity_bin_id, probability\n");
  }
  local_61 = from_event == to_event && from_event == 0;
  __stream = fopen(binFileName,"rb");
  idx.size = (longlong)fopen(idxFileName,"rb");
  if ((FILE *)idx.size == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: Footprint idx open failed\n");
    exit(3);
  }
  local_60 = fread((void *)((long)&i + 4),0x14,1,(FILE *)idx.size);
  while (local_60 != 0) {
    if ((local_61) || ((from_event <= i._4_4_ && (i._4_4_ <= to_event)))) {
      fseek(__stream,_auStack_50,0);
      printrows(i._4_4_,(FILE *)__stream,idx.offset);
    }
    local_60 = fread((void *)((long)&i + 4),0x14,1,(FILE *)idx.size);
  }
  fclose(__stream);
  fclose((FILE *)idx.size);
  return;
}

Assistant:

void doit(bool skipheader, int from_event, int to_event, const char * binFileName="footprint.bin", const char * idxFileName="footprint.idx")
	{
		if (skipheader == false)  printf("event_id, areaperil_id, intensity_bin_id, probability\n");
		bool no_event_range = ( (from_event == to_event) && (from_event == 0) );
		FILE *finx = fopen(binFileName, "rb");
		FILE *finy = fopen(idxFileName, "rb");

		EventIndex idx;

		if (finy == nullptr) {
			fprintf(stderr, "FATAL: Footprint idx open failed\n");
			exit(3);
		}
		size_t i = fread(&idx, sizeof(idx), 1, finy);
		while (i != 0) {
			if ((no_event_range) ||
			    (idx.event_id >= from_event && idx.event_id <= to_event)) {
				flseek(finx, idx.offset, SEEK_SET);
				printrows(idx.event_id, finx, idx.size);
			}
			i = fread(&idx, sizeof(idx), 1, finy);
		}

		fclose(finx);
		fclose(finy);
	}